

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Region.cpp
# Opt level: O0

vector<remote::Region,_std::allocator<remote::Region>_> *
remote::GetRegions(vector<remote::Region,_std::allocator<remote::Region>_> *__return_storage_ptr__,
                  pid_t pid)

{
  bool bVar1;
  ostream *poVar2;
  undefined8 uVar3;
  istream *piVar4;
  long lVar5;
  ulong uVar6;
  char *pcVar7;
  string local_748 [36];
  int local_724;
  long local_720;
  size_t firstNonSpace;
  string local_6f8 [32];
  string local_6d8 [32];
  long local_6b8;
  size_t spl_1;
  string local_690 [32];
  long local_670;
  size_t spl;
  stringstream ss;
  ostream local_658 [376];
  string local_4e0 [8];
  string content;
  size_t nextSpace;
  string str;
  size_t count;
  Region r;
  string line;
  istream local_3b8 [8];
  ifstream m;
  stringstream local_1a0 [8];
  stringstream path;
  ostream local_190 [379];
  byte local_15;
  pid_t local_14;
  vector<remote::Region,_std::allocator<remote::Region>_> *pvStack_10;
  pid_t pid_local;
  vector<remote::Region,_std::allocator<remote::Region>_> *ret;
  
  local_15 = 0;
  local_14 = pid;
  pvStack_10 = __return_storage_ptr__;
  std::vector<remote::Region,_std::allocator<remote::Region>_>::vector(__return_storage_ptr__);
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar2 = std::operator<<(local_190,"/proc/");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_14);
  std::operator<<(poVar2,"/maps");
  std::__cxx11::stringstream::str();
  uVar3 = std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_3b8,uVar3,8);
  std::__cxx11::string::~string((string *)(line.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(r.filename.field_2._M_local_buf + 8));
  do {
    piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       (local_3b8,(string *)(r.filename.field_2._M_local_buf + 8));
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
    if (!bVar1) {
      local_15 = 1;
      local_724 = 1;
      std::__cxx11::string::~string((string *)(r.filename.field_2._M_local_buf + 8));
      std::ifstream::~ifstream(local_3b8);
      std::__cxx11::stringstream::~stringstream(local_1a0);
      if ((local_15 & 1) == 0) {
        std::vector<remote::Region,_std::allocator<remote::Region>_>::~vector
                  (__return_storage_ptr__);
      }
      return __return_storage_ptr__;
    }
    Region::Region((Region *)&count);
    str.field_2._8_8_ = 0;
    std::__cxx11::string::string
              ((string *)&nextSpace,(string *)(r.filename.field_2._M_local_buf + 8));
    while (lVar5 = std::__cxx11::string::length(), lVar5 != 0) {
      lVar5 = std::__cxx11::string::find_first_of((char)&nextSpace,0x20);
      if (lVar5 == -1) {
        uVar6 = std::__cxx11::string::empty();
        if ((uVar6 & 1) == 0) {
          std::__cxx11::string::operator=((string *)&r.inodeFileNumber,(string *)&nextSpace);
          pcVar7 = (char *)std::__cxx11::string::c_str();
          if (*pcVar7 == '/') {
            std::__cxx11::string::find_last_of((char)&nextSpace,0x2f);
            std::__cxx11::string::length();
            std::__cxx11::string::substr((ulong)((long)&content.field_2 + 8),(ulong)&nextSpace);
            std::__cxx11::string::operator=
                      ((string *)(r.pathname.field_2._M_local_buf + 8),
                       (string *)(content.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)(content.field_2._M_local_buf + 8));
          }
          else {
            std::__cxx11::string::operator=
                      ((string *)(r.pathname.field_2._M_local_buf + 8),(string *)&r.inodeFileNumber)
            ;
          }
        }
        break;
      }
      std::__cxx11::string::substr((ulong)local_4e0,(ulong)&nextSpace);
      std::__cxx11::stringstream::stringstream((stringstream *)&spl);
      if (str.field_2._8_8_ == 0) {
        local_670 = std::__cxx11::string::find_first_of((char)local_4e0,0x2d);
        if (local_670 != -1) {
          poVar2 = (ostream *)std::ostream::operator<<(local_658,std::hex);
          std::__cxx11::string::substr((ulong)local_690,(ulong)local_4e0);
          std::operator<<(poVar2,local_690);
          std::__cxx11::string::~string(local_690);
          std::istream::operator>>((istream *)&spl,&count);
          std::ios::clear((long)&spl + *(long *)(spl - 0x18),0);
          poVar2 = (ostream *)std::ostream::operator<<(local_658,std::hex);
          std::__cxx11::string::size();
          std::__cxx11::string::substr((ulong)&spl_1,(ulong)local_4e0);
          std::operator<<(poVar2,(string *)&spl_1);
          std::__cxx11::string::~string((string *)&spl_1);
          std::istream::operator>>((istream *)&spl,&r.start);
          std::ios::clear((long)&spl + *(long *)(spl - 0x18),0);
        }
      }
      else if (str.field_2._8_8_ == 1) {
        pcVar7 = (char *)std::__cxx11::string::c_str();
        r.end._0_1_ = *pcVar7 == 'r';
        lVar5 = std::__cxx11::string::c_str();
        r.end._1_1_ = *(char *)(lVar5 + 1) == 'w';
        lVar5 = std::__cxx11::string::c_str();
        r.end._2_1_ = *(char *)(lVar5 + 2) == 'x';
        lVar5 = std::__cxx11::string::c_str();
        r.end._3_1_ = *(char *)(lVar5 + 3) == 'p';
      }
      else if (str.field_2._8_8_ == 2) {
        poVar2 = (ostream *)std::ostream::operator<<(local_658,std::hex);
        std::operator<<(poVar2,local_4e0);
        std::istream::operator>>((istream *)&spl,(ulong *)&r.read);
        std::ios::clear((long)&spl + *(long *)(spl - 0x18),0);
      }
      else if (str.field_2._8_8_ == 3) {
        local_6b8 = std::__cxx11::string::find_first_of((char)local_4e0,0x3a);
        if (local_6b8 != -1) {
          poVar2 = (ostream *)std::ostream::operator<<(local_658,std::dec);
          std::__cxx11::string::substr((ulong)local_6d8,(ulong)local_4e0);
          std::operator<<(poVar2,local_6d8);
          std::__cxx11::string::~string(local_6d8);
          std::istream::operator>>((istream *)&spl,&r.offset);
          std::ios::clear((long)&spl + *(long *)(spl - 0x18),0);
          poVar2 = (ostream *)std::ostream::operator<<(local_658,std::dec);
          std::__cxx11::string::size();
          std::__cxx11::string::substr((ulong)local_6f8,(ulong)local_4e0);
          std::operator<<(poVar2,local_6f8);
          std::__cxx11::string::~string(local_6f8);
          std::istream::operator>>((istream *)&spl,&r.deviceMajor);
          std::ios::clear((long)&spl + *(long *)(spl - 0x18),0);
        }
      }
      else if (str.field_2._8_8_ == 4) {
        std::operator<<(local_658,local_4e0);
        std::istream::operator>>((istream *)&spl,&r.deviceMinor);
        std::ios::clear((long)&spl + *(long *)(spl - 0x18),0);
      }
      str.field_2._8_8_ = str.field_2._8_8_ + 1;
      std::__cxx11::string::substr((ulong)&firstNonSpace,(ulong)&nextSpace);
      std::__cxx11::string::operator=((string *)&nextSpace,(string *)&firstNonSpace);
      std::__cxx11::string::~string((string *)&firstNonSpace);
      local_720 = std::__cxx11::string::find_first_not_of((char)&nextSpace,0x20);
      if (local_720 == -1) {
        local_724 = 5;
      }
      else {
        std::__cxx11::string::substr((ulong)local_748,(ulong)&nextSpace);
        std::__cxx11::string::operator=((string *)&nextSpace,local_748);
        std::__cxx11::string::~string(local_748);
        local_724 = 0;
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&spl);
      std::__cxx11::string::~string(local_4e0);
      if (local_724 != 0) break;
    }
    if ((count != 0) && (r.start != 0)) {
      std::vector<remote::Region,_std::allocator<remote::Region>_>::push_back
                (__return_storage_ptr__,(value_type *)&count);
    }
    std::__cxx11::string::~string((string *)&nextSpace);
    Region::~Region((Region *)&count);
  } while( true );
}

Assistant:

vector<Region> remote::GetRegions(pid_t pid) {
    vector<Region> ret;

    stringstream path;
    path << "/proc/" << pid << "/maps";

    ifstream m(path.str().c_str());

    string line;
    while(getline(m, line)) {
        Region r;

        size_t count = 0;

        string str = line;

        while(str.length()) {
            size_t nextSpace = str.find_first_of(' ');

            if(nextSpace == -1) {
                if(!str.empty()) {
                    r.pathname = str;

                    if(str.c_str()[0] == '/') {
                        r.filename = str.substr(str.find_last_of('/') + 1, str.length());
                    } else {
                        r.filename = r.pathname;
                    }
                }

                break; // Stuff
            } else {
                string content = str.substr(0, nextSpace);

                // Deal with content
                stringstream ss;

                if(count == 0) {
                    size_t spl = content.find_first_of('-');

                    if(spl != -1) {
                        ss << hex << content.substr(0, spl);
                        ss >> r.start;
                        ss.clear();
                        ss << hex << content.substr(spl + 1, content.size());
                        ss >> r.end;
                        ss.clear();
                    }
                } else if(count == 1) { // Permissions
                    r.read = (content.c_str()[0] == 'r');
                    r.write = (content.c_str()[1] == 'w');
                    r.exec = (content.c_str()[2] == 'x');
                    r.shared = (content.c_str()[3] == 'p');
                } else if(count == 2) { // Offset
                    ss << hex << content;
                    ss >> r.offset;
                    ss.clear();
                } else if(count == 3) { // Device Info
                    size_t spl = content.find_first_of(':');

                    if(spl != -1) {
                        ss << dec << content.substr(0, spl);
                        ss >> r.deviceMajor;
                        ss.clear();
                        ss << dec << content.substr(spl + 1, content.size());
                        ss >> r.deviceMinor;
                        ss.clear();
                    }
                } else if(count == 4) { // INode shit
                    ss << content;
                    ss >> r.inodeFileNumber;
                    ss.clear();
                }

                count++;

                // Advance
                str = str.substr(nextSpace);

                size_t firstNonSpace = str.find_first_not_of(' ');

                if(firstNonSpace == -1) {
                    break;
                }

                str = str.substr(firstNonSpace);
            }
        }

        if(r.start != 0 && r.end != 0) {
            ret.push_back(r);
        }
    }

    return ret;
}